

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

size_t ra_portable_deserialize_size(char *buf,size_t maxbytes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  ushort *puVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (3 < maxbytes) {
    uVar2 = *(uint *)buf;
    uVar3 = uVar2 & 0xffff;
    if (uVar2 == 0x303a || uVar3 == 0x303b) {
      if (uVar3 == 0x303b) {
        pcVar6 = buf + 4;
        uVar2 = (uVar2 >> 0x10) + 1;
        uVar10 = 4;
      }
      else {
        if (maxbytes < 8) {
          return 0;
        }
        uVar2 = *(uint *)(buf + 4);
        pcVar6 = buf + 8;
        uVar10 = 8;
      }
      if ((int)uVar2 < 0x10001) {
        if (uVar3 == 0x303b) {
          iVar8 = uVar2 + 0xe;
          if (-1 < (int)(uVar2 + 7)) {
            iVar8 = uVar2 + 7;
          }
          uVar10 = uVar10 + (long)(iVar8 >> 3);
          if (maxbytes < uVar10) {
            return 0;
          }
          pcVar7 = pcVar6 + (iVar8 >> 3);
        }
        else {
          pcVar7 = pcVar6;
          pcVar6 = (char *)0x0;
        }
        uVar10 = uVar10 + (long)(int)(uVar2 * 2) * 2;
        if (uVar10 <= maxbytes) {
          puVar9 = (ushort *)(pcVar7 + (long)(int)(uVar2 * 2) * 2);
          if (uVar3 != 0x303b || 3 < (int)uVar2) {
            uVar10 = uVar10 + (long)(int)(uVar2 * 4);
            if (maxbytes < uVar10) {
              return 0;
            }
            puVar9 = (ushort *)((long)puVar9 + (long)(int)(uVar2 * 4));
          }
          if ((int)uVar2 < 1) {
            return uVar10;
          }
          uVar11 = 0;
          do {
            uVar4 = (ulong)*(ushort *)(pcVar7 + uVar11 * 4 + 2);
            bVar12 = 0xfff < uVar4;
            if (uVar3 == 0x303b) {
              bVar12 = (1 << ((byte)uVar11 & 7) & (uint)(byte)pcVar6[uVar11 >> 3 & 0x1fffffff]) == 0
              ;
              bVar1 = !bVar12;
              bVar12 = bVar12 && 0xfff < *(ushort *)(pcVar7 + uVar11 * 4 + 2);
            }
            else {
              bVar1 = false;
            }
            if (bVar12) {
              uVar10 = uVar10 + 0x2000;
              puVar9 = puVar9 + (ulong)(uVar10 <= maxbytes) * 0x1000;
              if (maxbytes < uVar10) {
LAB_0011b9c9:
                bVar12 = false;
              }
              else {
LAB_0011b9f3:
                bVar12 = true;
              }
            }
            else {
              if (bVar1) {
                uVar10 = uVar10 + 2;
                if (maxbytes < uVar10) goto LAB_0011b9c9;
                lVar5 = (ulong)*puVar9 * 4;
                uVar10 = uVar10 + lVar5;
                if (maxbytes < uVar10) {
                  lVar5 = 0;
                }
                lVar5 = lVar5 + 2;
              }
              else {
                uVar10 = uVar10 + uVar4 * 2 + 2;
                lVar5 = 0;
                if (uVar10 <= maxbytes) {
                  lVar5 = uVar4 * 2 + 2;
                }
              }
              bVar12 = false;
              puVar9 = (ushort *)((long)puVar9 + lVar5);
              if (uVar10 <= maxbytes) goto LAB_0011b9f3;
            }
            if (!bVar12) {
              return 0;
            }
            uVar11 = uVar11 + 1;
            if (uVar2 == uVar11) {
              return uVar10;
            }
          } while( true );
        }
      }
    }
  }
  return 0;
}

Assistant:

size_t ra_portable_deserialize_size(const char *buf, const size_t maxbytes) {
    size_t bytestotal = sizeof(int32_t);  // for cookie
    if (bytestotal > maxbytes) return 0;
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        return 0;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        bytestotal += sizeof(int32_t);
        if (bytestotal > maxbytes) return 0;
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1 << 16)) {
        return 0;
    }
    char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        bytestotal += s;
        if (bytestotal > maxbytes) return 0;
        bitmapOfRunContainers = (char *)buf;
        buf += s;
    }
    bytestotal += size * 2 * sizeof(uint16_t);
    if (bytestotal > maxbytes) return 0;
    uint16_t *keyscards = (uint16_t *)buf;
    buf += size * 2 * sizeof(uint16_t);
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        // skipping the offsets
        bytestotal += size * 4;
        if (bytestotal > maxbytes) return 0;
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else if (isrun) {
            bytestotal += sizeof(uint16_t);
            if (bytestotal > maxbytes) return 0;
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            buf += sizeof(uint16_t);
            size_t containersize = n_runs * sizeof(rle16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else {
            size_t containersize = thiscard * sizeof(uint16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        }
    }
    return bytestotal;
}